

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.cc
# Opt level: O0

bool __thiscall google::protobuf::StringPiece::Consume(StringPiece *this,StringPiece x)

{
  StringPiece x_00;
  bool bVar1;
  char *in_RDX;
  StringPiece *in_RSI;
  long *in_RDI;
  
  x_00.length_ = (stringpiece_ssize_type)in_RDI;
  x_00.ptr_ = in_RDX;
  bVar1 = starts_with(in_RSI,x_00);
  if (bVar1) {
    *in_RDI = (long)(in_RDX + *in_RDI);
    in_RDI[1] = in_RDI[1] - (long)in_RDX;
  }
  return bVar1;
}

Assistant:

bool StringPiece::Consume(StringPiece x) {
  if (starts_with(x)) {
    ptr_ += x.length_;
    length_ -= x.length_;
    return true;
  }
  return false;
}